

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint32_t helper_float_cvts_l_mips64el(CPUMIPSState_conflict10 *env,uint64_t dt0)

{
  float32 fVar1;
  uintptr_t unaff_retaddr;
  uint32_t fst2;
  uint64_t dt0_local;
  CPUMIPSState_conflict10 *env_local;
  
  fVar1 = int64_to_float32_mips64el(dt0,&(env->active_fpu).fp_status);
  update_fcr31(env,unaff_retaddr);
  return fVar1;
}

Assistant:

uint32_t helper_float_cvts_l(CPUMIPSState *env, uint64_t dt0)
{
    uint32_t fst2;

    fst2 = int64_to_float32(dt0, &env->active_fpu.fp_status);
    update_fcr31(env, GETPC());
    return fst2;
}